

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gem_points.cpp
# Opt level: O2

void __thiscall Am_Point_List::Set(Am_Point_List *this,float x,float y,bool unique)

{
  Am_Point_List_Data *this_00;
  
  this_00 = this->data;
  if (this_00 != (Am_Point_List_Data *)0x0 && unique) {
    Am_Point_List_Data::Make_Unique(this_00,&this->data,&this->item);
  }
  Am_Point_List_Data::Set(this_00,x,y,this->item);
  return;
}

Assistant:

void
Am_Point_List::Set(float x, float y, bool unique)
{
  if (data) {
    if (unique)
      data->Make_Unique(data, item);
  }
  data->Set(x, y, item);
}